

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

FileDescriptor * unshield_get_file_descriptor(Unshield *unshield,int index)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Header *pHVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  long lVar13;
  FileDescriptor **ppFVar14;
  FileDescriptor *pFVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (-1 < index) {
    uVar8 = (ulong)(uint)index;
    pHVar5 = unshield->header_list;
    uVar3 = (pHVar5->cab).file_count;
    if (index < (int)uVar3) {
      ppFVar14 = pHVar5->file_descriptors;
      if (ppFVar14 == (FileDescriptor **)0x0) {
        ppFVar14 = (FileDescriptor **)calloc((ulong)uVar3,8);
        pHVar5->file_descriptors = ppFVar14;
      }
      if (ppFVar14[uVar8] != (FileDescriptor *)0x0) {
        return ppFVar14[uVar8];
      }
      pFVar15 = (FileDescriptor *)calloc(1,0x48);
      if ((pHVar5->major_version == 5) || (pHVar5->major_version == 0)) {
        puVar6 = pHVar5->data;
        lVar13 = (ulong)(pHVar5->cab).file_table_offset +
                 (ulong)(pHVar5->common).cab_descriptor_offset;
        uVar18 = (ulong)pHVar5->file_table[(pHVar5->cab).directory_count + index];
        lVar17 = uVar18 + lVar13;
        _unshield_log(3,"unshield_read_file_descriptor",0x36,"File descriptor offset %i: %08x",uVar8
                      ,lVar17);
        pFVar15->volume = (uint16_t)pHVar5->index;
        pFVar15->name_offset = *(uint32_t *)(puVar6 + uVar18 + lVar13);
        uVar3 = *(uint *)(puVar6 + uVar18 + 4 + lVar13);
        pFVar15->directory_index = uVar3;
        uVar2 = *(ushort *)(puVar6 + uVar18 + 8 + lVar13);
        pFVar15->flags = uVar2;
        uVar19 = (ulong)*(uint *)(puVar6 + uVar18 + 10 + lVar13);
        pFVar15->expanded_size = uVar19;
        uVar16 = (ulong)*(uint *)(puVar6 + uVar18 + 0xe + lVar13);
        pFVar15->compressed_size = uVar16;
        uVar4 = *(uint *)(puVar6 + uVar18 + 0x26 + lVar13);
        pFVar15->data_offset = (ulong)uVar4;
        _unshield_log(3,"unshield_read_file_descriptor",0x46,"Name offset:      %08x");
        _unshield_log(3,"unshield_read_file_descriptor",0x47,"Directory index:  %08x",(ulong)uVar3);
        _unshield_log(3,"unshield_read_file_descriptor",0x48,"Flags:            %04x",(ulong)uVar2);
        _unshield_log(3,"unshield_read_file_descriptor",0x49,"Expanded size:    %08x",uVar19);
        _unshield_log(3,"unshield_read_file_descriptor",0x4a,"Compressed size:  %08x");
        _unshield_log(3,"unshield_read_file_descriptor",0x4b,"Data offset:      %08x",(ulong)uVar4);
        if (pHVar5->major_version == 5) {
          uVar12 = *(undefined8 *)(puVar6 + lVar17 + 0x32);
          *(undefined8 *)pFVar15->md5 = *(undefined8 *)(puVar6 + lVar17 + 0x2a);
          *(undefined8 *)(pFVar15->md5 + 8) = uVar12;
        }
      }
      else {
        puVar7 = pHVar5->data;
        lVar13 = (ulong)(pHVar5->cab).file_table_offset2 + (ulong)(pHVar5->cab).file_table_offset +
                 (ulong)(pHVar5->common).cab_descriptor_offset;
        lVar17 = uVar8 * 0x57;
        _unshield_log(3,"unshield_read_file_descriptor",0x66,"File descriptor offset: %08x",
                      lVar17 + lVar13);
        uVar2 = *(ushort *)(puVar7 + lVar17 + lVar13);
        pFVar15->flags = uVar2;
        uVar19 = *(ulong *)(puVar7 + lVar17 + 2 + lVar13);
        pFVar15->expanded_size = uVar19;
        uVar16 = *(ulong *)(puVar7 + lVar17 + 10 + lVar13);
        pFVar15->compressed_size = uVar16;
        pFVar15->data_offset = *(uint64_t *)(puVar7 + lVar17 + 0x12 + lVar13);
        puVar6 = puVar7 + lVar17 + 0x1a + lVar13;
        uVar9 = *(undefined4 *)(puVar6 + 4);
        uVar10 = *(undefined4 *)(puVar6 + 8);
        uVar11 = *(undefined4 *)(puVar6 + 0xc);
        *(undefined4 *)pFVar15->md5 = *(undefined4 *)puVar6;
        *(undefined4 *)(pFVar15->md5 + 4) = uVar9;
        *(undefined4 *)(pFVar15->md5 + 8) = uVar10;
        *(undefined4 *)(pFVar15->md5 + 0xc) = uVar11;
        pFVar15->name_offset = *(uint32_t *)(puVar7 + lVar17 + 0x3a + lVar13);
        pFVar15->directory_index = (uint)*(ushort *)(puVar7 + lVar17 + 0x3e + lVar13);
        uVar3 = *(uint *)(puVar7 + lVar17 + 0x4c + lVar13);
        pFVar15->link_previous = uVar3;
        uVar4 = *(uint *)(puVar7 + lVar17 + 0x50 + lVar13);
        pFVar15->link_next = uVar4;
        bVar1 = puVar7[lVar17 + 0x54 + lVar13];
        pFVar15->link_flags = bVar1;
        if (bVar1 != 0) {
          _unshield_log(3,"unshield_read_file_descriptor",0x7c,
                        "Link: previous=%i, next=%i, flags=%i",(ulong)uVar3,(ulong)uVar4,(uint)bVar1
                       );
        }
        pFVar15->volume = *(uint16_t *)(puVar7 + lVar17 + lVar13 + 0x55);
      }
      if (((uVar2 & 4) == 0) && (uVar16 != uVar19)) {
        _unshield_log(2,"unshield_read_file_descriptor",0x8a,
                      "File is not compressed but compressed size is %08x and expanded size is %08x"
                      ,uVar16,uVar19);
      }
      pHVar5->file_descriptors[uVar8] = pFVar15;
      return pHVar5->file_descriptors[uVar8];
    }
  }
  _unshield_log(1,"unshield_get_file_descriptor",0x97,"Invalid index");
  return (FileDescriptor *)0x0;
}

Assistant:

static FileDescriptor* unshield_get_file_descriptor(Unshield* unshield, int index)
{
  /* XXX: multi-volume support... */
  Header* header = unshield->header_list;

  if (index < 0 || index >= (int)header->cab.file_count)
  {
    unshield_error("Invalid index");
    return NULL;
  }

  if (!header->file_descriptors)
    header->file_descriptors = calloc(header->cab.file_count, sizeof(FileDescriptor*));

  if (!header->file_descriptors[index])
    header->file_descriptors[index] = unshield_read_file_descriptor(unshield, index);

  return header->file_descriptors[index];
}